

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

int Saig_ManDemiter(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  Aig_Man_t *p_00;
  Aig_Man_t **ppAVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  uint local_70;
  int local_6c;
  int Counter;
  int i;
  Aig_Obj_t *pFlop1;
  Aig_Obj_t *pFlop0;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSet1;
  Vec_Ptr_t *vSet0;
  Vec_Ptr_t *vPairs;
  Aig_Man_t **ppAig1_local;
  Aig_Man_t **ppAig0_local;
  Aig_Man_t *p_local;
  
  vPairs = (Vec_Ptr_t *)ppAig1;
  ppAig1_local = ppAig0;
  ppAig0_local = (Aig_Man_t **)p;
  iVar2 = Saig_ManRegNum(p);
  if (iVar2 < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                  ,0x38c,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
  }
  Aig_ManSetCioIds((Aig_Man_t *)ppAig0_local);
  iVar2 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local);
  vSet0 = Vec_PtrAlloc(iVar2 << 1);
  for (local_6c = 0; iVar2 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local), local_6c < iVar2;
      local_6c = local_6c + 1) {
    pObj0 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)ppAig0_local[3],local_6c);
    pAVar3 = Aig_ObjFanin0(pObj0);
    iVar2 = Aig_ObjRecognizeExor(pAVar3,&pObj1,&pFlop0);
    if (iVar2 == 0) {
      Vec_PtrFree(vSet0);
      return 0;
    }
    Vec_PtrPush(vSet0,pObj1);
    Vec_PtrPush(vSet0,pFlop0);
  }
  iVar2 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local);
  vSet1 = Vec_PtrAlloc(iVar2);
  iVar2 = Saig_ManPoNum((Aig_Man_t *)ppAig0_local);
  pObj = (Aig_Obj_t *)Vec_PtrAlloc(iVar2);
  pObj1 = (Aig_Obj_t *)Vec_PtrEntry(vSet0,0);
  pFlop0 = (Aig_Obj_t *)Vec_PtrEntry(vSet0,1);
  Aig_ManIncrementTravId((Aig_Man_t *)ppAig0_local);
  ppAVar1 = ppAig0_local;
  pAVar3 = Aig_Regular(pObj1);
  Saig_ManDemiterLabel_rec((Aig_Man_t *)ppAVar1,pAVar3,0);
  Vec_PtrPush(vSet1,pObj1);
  Aig_ManIncrementTravId((Aig_Man_t *)ppAig0_local);
  ppAVar1 = ppAig0_local;
  pAVar3 = Aig_Regular(pFlop0);
  Saig_ManDemiterLabel_rec((Aig_Man_t *)ppAVar1,pAVar3,1);
  Vec_PtrPush((Vec_Ptr_t *)pObj,pFlop0);
  for (local_6c = 2; iVar2 = Vec_PtrSize(vSet0), local_6c < iVar2; local_6c = local_6c + 2) {
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry(vSet0,local_6c);
    pFlop0 = (Aig_Obj_t *)Vec_PtrEntry(vSet0,local_6c + 1);
    Aig_ManIncrementTravId((Aig_Man_t *)ppAig0_local);
    ppAVar1 = ppAig0_local;
    pAVar3 = Aig_Regular(pObj1);
    pAVar3 = Saig_ManGetLabeledRegister_rec((Aig_Man_t *)ppAVar1,pAVar3);
    Aig_ManIncrementTravId((Aig_Man_t *)ppAig0_local);
    ppAVar1 = ppAig0_local;
    pAVar4 = Aig_Regular(pFlop0);
    pAVar4 = Saig_ManGetLabeledRegister_rec((Aig_Man_t *)ppAVar1,pAVar4);
    if ((((((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0) &&
          ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) != 0)) ||
         (((*(ulong *)&pAVar4->field_0x18 >> 4 & 1) != 0 &&
          ((*(ulong *)&pAVar4->field_0x18 >> 5 & 1) != 0)))) ||
        (((*(ulong *)&pAVar3->field_0x18 >> 4 & 1) != 0 &&
         ((*(ulong *)&pAVar4->field_0x18 >> 4 & 1) != 0)))) ||
       (((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) != 0 &&
        ((*(ulong *)&pAVar4->field_0x18 >> 5 & 1) != 0)))) {
      printf("Ouput pair %4d: Difficult case...\n",(long)local_6c / 2 & 0xffffffff,
             (long)local_6c % 2 & 0xffffffff);
    }
    if ((*(ulong *)&pAVar3->field_0x18 >> 5 & 1) == 0) {
      Saig_ManDemiterLabel_rec((Aig_Man_t *)ppAig0_local,pObj1,0);
      Vec_PtrPush((Vec_Ptr_t *)pObj,pObj1);
    }
    else {
      Saig_ManDemiterLabel_rec((Aig_Man_t *)ppAig0_local,pObj1,1);
      Vec_PtrPush(vSet1,pObj1);
    }
    if ((*(ulong *)&pAVar4->field_0x18 >> 5 & 1) == 0) {
      Saig_ManDemiterLabel_rec((Aig_Man_t *)ppAig0_local,pFlop0,0);
      Vec_PtrPush((Vec_Ptr_t *)pObj,pFlop0);
    }
    else {
      Saig_ManDemiterLabel_rec((Aig_Man_t *)ppAig0_local,pFlop0,1);
      Vec_PtrPush(vSet1,pFlop0);
    }
  }
  local_70 = 0;
  for (local_6c = 0; iVar2 = Saig_ManRegNum((Aig_Man_t *)ppAig0_local), local_6c < iVar2;
      local_6c = local_6c + 1) {
    p_00 = ppAig0_local[2];
    iVar2 = Saig_ManPiNum((Aig_Man_t *)ppAig0_local);
    pObj0 = (Aig_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)p_00,local_6c + iVar2);
    if (((*(ulong *)&pObj0->field_0x18 >> 4 & 1) != 0) &&
       ((*(ulong *)&pObj0->field_0x18 >> 5 & 1) != 0)) {
      local_70 = local_70 + 1;
    }
  }
  if (0 < (int)local_70) {
    printf("The miters contains %d flops reachable from both AIGs.\n",(ulong)local_70);
  }
  if (ppAig1_local == (Aig_Man_t **)0x0) {
    if (vPairs == (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(vSet1);
      Vec_PtrFree((Vec_Ptr_t *)pObj);
      Vec_PtrFree(vSet0);
      return 1;
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                  ,0x3df,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                ,0x3d8,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
}

Assistant:

int Saig_ManDemiter( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vPairs, * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pObj0, * pObj1, * pFlop0, * pFlop1;
    int i, Counter;
    assert( Saig_ManRegNum(p) > 0 );
    Aig_ManSetCioIds( p );
    // check if demitering is possible
    vPairs = Vec_PtrAlloc( 2 * Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( !Aig_ObjRecognizeExor( Aig_ObjFanin0(pObj), &pObj0, &pObj1 ) )
        {
            Vec_PtrFree( vPairs );
            return 0;
        }
        Vec_PtrPush( vPairs, pObj0 );
        Vec_PtrPush( vPairs, pObj1 );
    }
    // start array of outputs
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    // get the first pair of outputs
    pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 0 );
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 1 );
    // label registers reachable from the outputs
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj0), 0 );
    Vec_PtrPush( vSet0, pObj0 );
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj1), 1 );
    Vec_PtrPush( vSet1, pObj1 );
    // find where each output belongs
    for ( i = 2; i < Vec_PtrSize(vPairs); i += 2 )
    {
        pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i   );
        pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i+1 );

        Aig_ManIncrementTravId( p );
        pFlop0 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj0) );

        Aig_ManIncrementTravId( p );
        pFlop1 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj1) );

        if ( (pFlop0->fMarkA && pFlop0->fMarkB) || (pFlop1->fMarkA && pFlop1->fMarkB) || 
             (pFlop0->fMarkA && pFlop1->fMarkA) || (pFlop0->fMarkB && pFlop1->fMarkB)  )
            printf( "Ouput pair %4d: Difficult case...\n", i/2 );

        if ( pFlop0->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 1 );
            Vec_PtrPush( vSet0, pObj0 );
        }
        else // if ( pFlop0->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 0 );
            Vec_PtrPush( vSet1, pObj0 );
        }

        if ( pFlop1->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 1 );
            Vec_PtrPush( vSet0, pObj1 );
        }
        else // if ( pFlop1->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
    }
    // check if there are any flops in common
    Counter = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( pObj->fMarkA && pObj->fMarkB )
            Counter++;
    if ( Counter > 0 )
        printf( "The miters contains %d flops reachable from both AIGs.\n", Counter );

    // produce two miters
    if ( ppAig0 )
    {
        assert( 0 );
        *ppAig0 = Aig_ManDupNodesHalf( p, vSet0, 0 ); // not ready
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        assert( 0 );
        *ppAig1 = Aig_ManDupNodesHalf( p, vSet1, 1 ); // not ready
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    Vec_PtrFree( vPairs );
    return 1;
}